

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O0

StringRef getArchSynonym(StringRef Arch)

{
  StringRef SVar1;
  bool bVar2;
  StringRef *pSVar3;
  StringLiteral local_1dc0;
  char *local_1db0;
  StringLiteral local_1da0;
  char *local_1d90;
  StringLiteral local_1d80;
  char *local_1d70;
  StringLiteral local_1d60;
  char *local_1d50;
  StringLiteral local_1d40;
  char *local_1d30;
  StringLiteral local_1d20;
  char *local_1d10;
  StringLiteral local_1d00;
  char *local_1cf0;
  StringLiteral local_1ce0;
  StringLiteral local_1cd0;
  StringLiteral local_1cc0;
  StringLiteral local_1cb0;
  StringLiteral local_1ca0;
  char *local_1c90;
  StringLiteral local_1c80;
  char *local_1c70;
  StringLiteral local_1c60;
  char *local_1c50;
  StringLiteral local_1c40;
  char *local_1c30;
  StringLiteral local_1c20;
  StringLiteral local_1c10;
  StringLiteral local_1c00;
  StringLiteral local_1bf0;
  char *local_1be0;
  StringLiteral local_1bd0;
  StringLiteral local_1bc0;
  char *local_1bb0;
  StringLiteral local_1ba0;
  StringLiteral local_1b90;
  StringLiteral local_1b80;
  char *local_1b70;
  StringLiteral local_1b60;
  char *local_1b50;
  StringLiteral local_1b40;
  char *local_1b30;
  StringLiteral local_1b20;
  char *local_1b10;
  StringLiteral local_1b00;
  char *local_1af0;
  char *local_1ae8;
  char *local_1ae0;
  char *local_1ad8;
  Optional<llvm::StringRef> OStack_1ad0;
  char *local_1ab8;
  StringRef Arch_local;
  StringRef local_1938;
  char *local_1928;
  char *local_1920;
  char *local_1918;
  char *local_1910;
  char *local_1908;
  char *local_1900;
  char *local_18f8;
  char *local_18f0;
  char **local_18e8;
  char *local_18e0;
  char *local_18d8;
  char *local_18d0;
  char *local_18c8;
  char *local_18c0;
  int local_18b4;
  char *local_18b0;
  char *local_18a8;
  char *local_18a0;
  char *local_1898;
  char **local_1890;
  StringRef local_1888;
  char *local_1878;
  char *local_1870;
  char *local_1868;
  char *local_1860;
  char *local_1858;
  char *local_1850;
  char *local_1848;
  char *local_1840;
  char **local_1838;
  char *local_1830;
  char *local_1828;
  char *local_1820;
  char *local_1818;
  char *local_1810;
  int local_1804;
  char *local_1800;
  char *local_17f8;
  char *local_17f0;
  char *local_17e8;
  char **local_17e0;
  StringRef local_17d8;
  char *local_17c8;
  char *local_17c0;
  char *local_17b8;
  char *local_17b0;
  char *local_17a8;
  char *local_17a0;
  char *local_1798;
  char *local_1790;
  char **local_1788;
  char *local_1780;
  char *local_1778;
  char *local_1770;
  char *local_1768;
  char *local_1760;
  int local_1754;
  char *local_1750;
  char *local_1748;
  char *local_1740;
  char *local_1738;
  char **local_1730;
  StringRef local_1728;
  char *local_1718;
  char *local_1710;
  char *local_1708;
  char *local_1700;
  char *local_16f8;
  char *local_16f0;
  char *local_16e8;
  char *local_16e0;
  char **local_16d8;
  char *local_16d0;
  char *local_16c8;
  char *local_16c0;
  char *local_16b8;
  char *local_16b0;
  int local_16a4;
  char *local_16a0;
  char *local_1698;
  char *local_1690;
  char *local_1688;
  char **local_1680;
  StringRef local_1678;
  char *local_1668;
  char *local_1660;
  char *local_1658;
  char *local_1650;
  char *local_1648;
  char *local_1640;
  char *local_1638;
  char *local_1630;
  char **local_1628;
  char *local_1620;
  char *local_1618;
  char *local_1610;
  char *local_1608;
  char *local_1600;
  int local_15f4;
  char *local_15f0;
  char *local_15e8;
  char *local_15e0;
  char *local_15d8;
  char **local_15d0;
  StringRef local_15c8;
  char *local_15b8;
  char *local_15b0;
  char *local_15a8;
  char *local_15a0;
  char *local_1598;
  char *local_1590;
  char *local_1588;
  char *local_1580;
  char **local_1578;
  char *local_1570;
  char *local_1568;
  char *local_1560;
  char *local_1558;
  char *local_1550;
  int local_1544;
  char *local_1540;
  char *local_1538;
  char *local_1530;
  char *local_1528;
  char **local_1520;
  StringRef local_1518;
  char *local_1508;
  char *local_1500;
  char *local_14f8;
  char *local_14f0;
  char *local_14e8;
  char *local_14e0;
  char *local_14d8;
  char *local_14d0;
  char **local_14c8;
  char *local_14c0;
  char *local_14b8;
  char *local_14b0;
  char *local_14a8;
  char *local_14a0;
  int local_1494;
  char *local_1490;
  char *local_1488;
  char *local_1480;
  char *local_1478;
  char **local_1470;
  StringRef local_1468;
  char *local_1458;
  char *local_1450;
  char *local_1448;
  char *local_1440;
  char *local_1438;
  char *local_1430;
  char *local_1428;
  char *local_1420;
  char **local_1418;
  char *local_1410;
  char *local_1408;
  char *local_1400;
  char *local_13f8;
  char *local_13f0;
  int local_13e4;
  char *local_13e0;
  char *local_13d8;
  char *local_13d0;
  char *local_13c8;
  char **local_13c0;
  StringRef local_13b8;
  char *local_13a8;
  char *local_13a0;
  char *local_1398;
  char *local_1390;
  char *local_1388;
  char *local_1380;
  char *local_1378;
  char *local_1370;
  char **local_1368;
  char *local_1360;
  char *local_1358;
  char *local_1350;
  char *local_1348;
  char *local_1340;
  int local_1334;
  char *local_1330;
  char *local_1328;
  char *local_1320;
  char *local_1318;
  char **local_1310;
  StringRef local_1308;
  char *local_12f8;
  char *local_12f0;
  char *local_12e8;
  char *local_12e0;
  char *local_12d8;
  char *local_12d0;
  char *local_12c8;
  char *local_12c0;
  char **local_12b8;
  char *local_12b0;
  char *local_12a8;
  char *local_12a0;
  char *local_1298;
  char *local_1290;
  int local_1284;
  char *local_1280;
  char *local_1278;
  char *local_1270;
  char *local_1268;
  char **local_1260;
  StringRef local_1258;
  char *local_1248;
  char *local_1240;
  char *local_1238;
  char *local_1230;
  char *local_1228;
  char *local_1220;
  char *local_1218;
  char *local_1210;
  char **local_1208;
  char *local_1200;
  char *local_11f8;
  char *local_11f0;
  char *local_11e8;
  char *local_11e0;
  int local_11d4;
  char *local_11d0;
  char *local_11c8;
  char *local_11c0;
  char *local_11b8;
  char **local_11b0;
  StringRef local_11a8;
  char *local_1198;
  char *local_1190;
  char *local_1188;
  char *local_1180;
  char *local_1178;
  char *local_1170;
  char *local_1168;
  char *local_1160;
  char **local_1158;
  char *local_1150;
  char *local_1148;
  char *local_1140;
  char *local_1138;
  char *local_1130;
  int local_1124;
  char *local_1120;
  char *local_1118;
  char *local_1110;
  char *local_1108;
  char **local_1100;
  StringRef local_10f8;
  char *local_10e8;
  char *local_10e0;
  char *local_10d8;
  char *local_10d0;
  char *local_10c8;
  char *local_10c0;
  char *local_10b8;
  char *local_10b0;
  char **local_10a8;
  char *local_10a0;
  char *local_1098;
  char *local_1090;
  char *local_1088;
  char *local_1080;
  int local_1074;
  char *local_1070;
  char *local_1068;
  char *local_1060;
  char *local_1058;
  char **local_1050;
  StringRef local_1048;
  char *local_1038;
  char *local_1030;
  char *local_1028;
  char *local_1020;
  char *local_1018;
  char *local_1010;
  char *local_1008;
  char *local_1000;
  char **local_ff8;
  char *local_ff0;
  char *local_fe8;
  char *local_fe0;
  char *local_fd8;
  char *local_fd0;
  int local_fc4;
  char **local_fc0;
  char *local_fb8;
  char *local_fb0;
  char *local_fa8;
  char *local_fa0;
  char *local_f98;
  char *local_f90;
  char *local_f88;
  char *local_f80;
  char *local_f78;
  size_t local_f70;
  char *local_f68;
  size_t local_f60;
  char *local_f58;
  char *local_f50;
  char *local_f48;
  char *local_f40;
  char *local_f38;
  char *local_f30;
  char *local_f28;
  size_t local_f20;
  char *local_f18;
  char *local_f10;
  char **local_f08;
  char *local_f00;
  char *local_ef8;
  char *local_ef0;
  char *local_ee8;
  char *local_ee0;
  char *local_ed8;
  char *local_ed0;
  char *local_ec8;
  char **local_ec0;
  StringRef local_eb8;
  char *local_ea8;
  char *local_ea0;
  char *local_e98;
  char *local_e90;
  char *local_e88;
  char *local_e80;
  char *local_e78;
  char *local_e70;
  char **local_e68;
  char *local_e60;
  char *local_e58;
  char *local_e50;
  char *local_e48;
  char *local_e40;
  int local_e34;
  char *local_e30;
  size_t local_e28;
  char *local_e20;
  size_t local_e18;
  char *local_e10;
  char *local_e08;
  char *local_e00;
  size_t local_df8;
  char *local_df0;
  char *local_de8;
  char **local_de0;
  char *local_dd8;
  char *local_dd0;
  char *local_dc8;
  char *local_dc0;
  char *local_db8;
  char *local_db0;
  char *local_da8;
  char *local_da0;
  char **local_d98;
  StringRef local_d90;
  char *local_d80;
  char *local_d78;
  char *local_d70;
  char *local_d68;
  char *local_d60;
  char *local_d58;
  char *local_d50;
  char *local_d48;
  char **local_d40;
  char *local_d38;
  char *local_d30;
  char *local_d28;
  char *local_d20;
  char *local_d18;
  int local_d0c;
  char *local_d08;
  char *local_d00;
  char *local_cf8;
  char *local_cf0;
  char **local_ce8;
  StringRef local_ce0;
  char *local_cd0;
  char *local_cc8;
  char *local_cc0;
  char *local_cb8;
  char *local_cb0;
  char *local_ca8;
  char *local_ca0;
  char *local_c98;
  char **local_c90;
  char *local_c88;
  char *local_c80;
  char *local_c78;
  char *local_c70;
  char *local_c68;
  int local_c5c;
  char *local_c58;
  char *local_c50;
  char *local_c48;
  size_t local_c40;
  char *local_c38;
  size_t local_c30;
  char *local_c28;
  char *local_c20;
  char *local_c18;
  char *local_c10;
  char *local_c08;
  size_t local_c00;
  char *local_bf8;
  char *local_bf0;
  char **local_be8;
  char *local_be0;
  char *local_bd8;
  char *local_bd0;
  char *local_bc8;
  char *local_bc0;
  char *local_bb8;
  char *local_bb0;
  char *local_ba8;
  char **local_ba0;
  StringRef local_b98;
  char *local_b88;
  char *local_b80;
  char *local_b78;
  char *local_b70;
  char *local_b68;
  char *local_b60;
  char *local_b58;
  char *local_b50;
  char **local_b48;
  char *local_b40;
  char *local_b38;
  char *local_b30;
  char *local_b28;
  char *local_b20;
  int local_b14;
  char *local_b10;
  size_t local_b08;
  char *local_b00;
  size_t local_af8;
  char *local_af0;
  char *local_ae8;
  char *local_ae0;
  size_t local_ad8;
  char *local_ad0;
  char *local_ac8;
  char **local_ac0;
  char *local_ab8;
  char *local_ab0;
  char *local_aa8;
  char *local_aa0;
  char *local_a98;
  char *local_a90;
  char *local_a88;
  char *local_a80;
  char **local_a78;
  StringRef local_a70;
  char *local_a60;
  char *local_a58;
  char *local_a50;
  char *local_a48;
  char *local_a40;
  char *local_a38;
  char *local_a30;
  char *local_a28;
  char **local_a20;
  char *local_a18;
  char *local_a10;
  char *local_a08;
  char *local_a00;
  char *local_9f8;
  int local_9ec;
  char *local_9e8;
  char *local_9e0;
  char *local_9d8;
  char *local_9d0;
  char **local_9c8;
  StringRef local_9c0;
  char *local_9b0;
  char *local_9a8;
  char *local_9a0;
  char *local_998;
  char *local_990;
  char *local_988;
  char *local_980;
  char *local_978;
  char **local_970;
  char *local_968;
  char *local_960;
  char *local_958;
  char *local_950;
  char *local_948;
  int local_93c;
  char *local_938;
  char *local_930;
  char *local_928;
  size_t local_920;
  char *local_918;
  size_t local_910;
  char *local_908;
  char *local_900;
  char *local_8f8;
  char *local_8f0;
  char *local_8e8;
  size_t local_8e0;
  char *local_8d8;
  char *local_8d0;
  char **local_8c8;
  char *local_8c0;
  char *local_8b8;
  char *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  char **local_880;
  StringRef local_878;
  char *local_868;
  char *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  char **local_828;
  char *local_820;
  char *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  int local_7f4;
  char *local_7f0;
  size_t local_7e8;
  char *local_7e0;
  size_t local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  size_t local_7b8;
  char *local_7b0;
  char *local_7a8;
  char **local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  char **local_758;
  StringRef local_750;
  char *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  char **local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  int local_6cc;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  char **local_6a8;
  StringRef local_6a0;
  char *local_690;
  char *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  char **local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  int local_61c;
  char *local_618;
  char *local_610;
  char *local_608;
  char *local_600;
  char *local_5f8;
  char *local_5f0;
  char *local_5e8;
  size_t local_5e0;
  char *local_5d8;
  size_t local_5d0;
  char *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  char *local_598;
  char *local_590;
  char *local_588;
  size_t local_580;
  char *local_578;
  char *local_570;
  char **local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  char **local_520;
  StringRef local_518;
  char *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char **local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  int local_494;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  size_t local_468;
  char *local_460;
  size_t local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  size_t local_418;
  char *local_410;
  char *local_408;
  char **local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char **local_3b8;
  StringRef local_3b0;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char **local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  int local_32c;
  char *local_328;
  char *local_320;
  char *local_318;
  size_t local_310;
  char *local_308;
  size_t local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  size_t local_2d0;
  char *local_2c8;
  char *local_2c0;
  char **local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char **local_270;
  StringRef local_268;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char **local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  int local_1e4;
  char *local_1e0;
  size_t local_1d8;
  char *local_1d0;
  size_t local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  size_t local_1a8;
  char *local_1a0;
  char *local_198;
  char **local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char **local_148;
  StringRef local_140;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char **local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  int local_bc;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char **local_98;
  StringRef local_90;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char **local_40;
  char *local_38;
  char *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  int local_c;
  
  local_1ae8 = (char *)Arch.Length;
  local_1af0 = Arch.Data;
  local_1ab8 = local_1af0;
  Arch_local.Data = local_1ae8;
  local_1ae0 = local_1af0;
  local_1ad8 = local_1ae8;
  llvm::Optional<llvm::StringRef>::Optional(&OStack_1ad0);
  llvm::StringLiteral::StringLiteral<3UL>(&local_1b00,(char (*) [3])"v5");
  local_1b10 = "v5t";
  local_1048.Length = strlen("v5t");
  local_1038 = local_1b00.super_StringRef.Data;
  local_1030 = (char *)local_1b00.super_StringRef.Length;
  local_1048.Data = local_1b10;
  local_1050 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_1060 = local_1ae0;
    local_1058 = local_1ad8;
    local_1070 = local_1038;
    local_1068 = local_1030;
    local_1018 = local_1038;
    local_1010 = local_1030;
    local_1028 = local_1038;
    local_1020 = local_1030;
    local_ff0 = local_1038;
    local_fe8 = local_1030;
    local_ff8 = &local_1008;
    bVar2 = false;
    local_1008 = local_1060;
    local_1000 = local_1058;
    if (local_1ad8 == local_1030) {
      local_fd0 = local_1ae0;
      local_fd8 = local_1038;
      local_fe0 = local_1030;
      if (local_1030 == (char *)0x0) {
        local_fc4 = 0;
      }
      else {
        local_fc4 = memcmp(local_1ae0,local_1038,(size_t)local_1030);
      }
      bVar2 = local_fc4 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_1048);
    }
  }
  llvm::StringLiteral::StringLiteral<4UL>(&local_1b20,(char (*) [4])"v5e");
  local_1b30 = "v5te";
  local_10f8.Length = strlen("v5te");
  local_10e8 = local_1b20.super_StringRef.Data;
  local_10e0 = (char *)local_1b20.super_StringRef.Length;
  local_10f8.Data = local_1b30;
  local_1100 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_1110 = local_1ae0;
    local_1108 = local_1ad8;
    local_1120 = local_10e8;
    local_1118 = local_10e0;
    local_10c8 = local_10e8;
    local_10c0 = local_10e0;
    local_10d8 = local_10e8;
    local_10d0 = local_10e0;
    local_10a0 = local_10e8;
    local_1098 = local_10e0;
    local_10a8 = &local_10b8;
    bVar2 = false;
    local_10b8 = local_1110;
    local_10b0 = local_1108;
    if (local_1ad8 == local_10e0) {
      local_1080 = local_1ae0;
      local_1088 = local_10e8;
      local_1090 = local_10e0;
      if (local_10e0 == (char *)0x0) {
        local_1074 = 0;
      }
      else {
        local_1074 = memcmp(local_1ae0,local_10e8,(size_t)local_10e0);
      }
      bVar2 = local_1074 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_10f8);
    }
  }
  llvm::StringLiteral::StringLiteral<4UL>(&local_1b40,(char (*) [4])"v6j");
  local_1b50 = "v6";
  local_11a8.Length = strlen("v6");
  local_1198 = local_1b40.super_StringRef.Data;
  local_1190 = (char *)local_1b40.super_StringRef.Length;
  local_11a8.Data = local_1b50;
  local_11b0 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_11c0 = local_1ae0;
    local_11b8 = local_1ad8;
    local_11d0 = local_1198;
    local_11c8 = local_1190;
    local_1178 = local_1198;
    local_1170 = local_1190;
    local_1188 = local_1198;
    local_1180 = local_1190;
    local_1150 = local_1198;
    local_1148 = local_1190;
    local_1158 = &local_1168;
    bVar2 = false;
    local_1168 = local_11c0;
    local_1160 = local_11b8;
    if (local_1ad8 == local_1190) {
      local_1130 = local_1ae0;
      local_1138 = local_1198;
      local_1140 = local_1190;
      if (local_1190 == (char *)0x0) {
        local_1124 = 0;
      }
      else {
        local_1124 = memcmp(local_1ae0,local_1198,(size_t)local_1190);
      }
      bVar2 = local_1124 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_11a8);
    }
  }
  llvm::StringLiteral::StringLiteral<5UL>(&local_1b60,(char (*) [5])"v6hl");
  local_1b70 = "v6k";
  local_1258.Length = strlen("v6k");
  local_1248 = local_1b60.super_StringRef.Data;
  local_1240 = (char *)local_1b60.super_StringRef.Length;
  local_1258.Data = local_1b70;
  local_1260 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_1270 = local_1ae0;
    local_1268 = local_1ad8;
    local_1280 = local_1248;
    local_1278 = local_1240;
    local_1228 = local_1248;
    local_1220 = local_1240;
    local_1238 = local_1248;
    local_1230 = local_1240;
    local_1200 = local_1248;
    local_11f8 = local_1240;
    local_1208 = &local_1218;
    bVar2 = false;
    local_1218 = local_1270;
    local_1210 = local_1268;
    if (local_1ad8 == local_1240) {
      local_11e0 = local_1ae0;
      local_11e8 = local_1248;
      local_11f0 = local_1240;
      if (local_1240 == (char *)0x0) {
        local_11d4 = 0;
      }
      else {
        local_11d4 = memcmp(local_1ae0,local_1248,(size_t)local_1240);
      }
      bVar2 = local_11d4 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_1258);
    }
  }
  llvm::StringLiteral::StringLiteral<4UL>(&local_1b80,(char (*) [4])"v6m");
  llvm::StringLiteral::StringLiteral<5UL>(&local_1b90,(char (*) [5])"v6sm");
  llvm::StringLiteral::StringLiteral<6UL>(&local_1ba0,(char (*) [6])"v6s-m");
  local_1bb0 = "v6-m";
  local_920 = strlen("v6-m");
  local_928 = local_1bb0;
  local_938 = local_1ba0.super_StringRef.Data;
  local_930 = (char *)local_1ba0.super_StringRef.Length;
  local_8b0 = local_1b80.super_StringRef.Data;
  local_8a8 = (char *)local_1b80.super_StringRef.Length;
  local_8c0 = local_1b90.super_StringRef.Data;
  local_8b8 = (char *)local_1b90.super_StringRef.Length;
  local_8d8 = local_1b80.super_StringRef.Data;
  local_8d0 = (char *)local_1b80.super_StringRef.Length;
  local_8e8 = local_1bb0;
  local_868 = local_1b80.super_StringRef.Data;
  local_860 = (char *)local_1b80.super_StringRef.Length;
  local_878.Data = local_1bb0;
  local_8e0 = local_920;
  local_8c8 = &local_1ae0;
  local_880 = &local_1ae0;
  local_878.Length = local_920;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_890 = local_1ae0;
    local_888 = local_1ad8;
    local_8a0 = local_868;
    local_898 = local_860;
    local_848 = local_868;
    local_840 = local_860;
    local_858 = local_868;
    local_850 = local_860;
    local_820 = local_868;
    local_818 = local_860;
    local_828 = &local_838;
    bVar2 = false;
    local_838 = local_890;
    local_830 = local_888;
    if (local_1ad8 == local_860) {
      local_800 = local_1ae0;
      local_808 = local_868;
      local_810 = local_860;
      if (local_860 == (char *)0x0) {
        local_7f4 = 0;
      }
      else {
        local_7f4 = memcmp(local_1ae0,local_868,(size_t)local_860);
      }
      bVar2 = local_7f4 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_878);
    }
  }
  local_8f8 = local_8c0;
  local_8f0 = local_8b8;
  local_908 = local_938;
  local_900 = local_930;
  local_918 = local_928;
  local_910 = local_920;
  local_7f0 = local_928;
  local_7e8 = local_920;
  local_788 = local_8c0;
  local_780 = local_8b8;
  local_798 = local_938;
  local_790 = local_930;
  local_7b0 = local_8c0;
  local_7a8 = local_8b8;
  local_7c0 = local_928;
  local_7b8 = local_920;
  local_690 = local_8c0;
  local_688 = local_8b8;
  local_6a0.Data = local_928;
  local_6a0.Length = local_920;
  local_7a0 = &local_1ae0;
  local_6a8 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_6b8 = local_1ae0;
    local_6b0 = local_1ad8;
    local_6c8 = local_690;
    local_6c0 = local_688;
    local_670 = local_690;
    local_668 = local_688;
    local_680 = local_690;
    local_678 = local_688;
    local_648 = local_690;
    local_640 = local_688;
    local_650 = &local_660;
    bVar2 = false;
    local_660 = local_6b8;
    local_658 = local_6b0;
    if (local_1ad8 == local_688) {
      local_628 = local_1ae0;
      local_630 = local_690;
      local_638 = local_688;
      if (local_688 == (char *)0x0) {
        local_61c = 0;
      }
      else {
        local_61c = memcmp(local_1ae0,local_690,(size_t)local_688);
      }
      bVar2 = local_61c == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_6a0);
    }
  }
  local_7d0 = local_798;
  local_7c8 = local_790;
  local_7e0 = local_7f0;
  local_7d8 = local_7e8;
  local_740 = local_798;
  local_738 = local_790;
  local_750.Data = local_7f0;
  local_750.Length = local_7e8;
  local_758 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_768 = local_1ae0;
    local_760 = local_1ad8;
    local_778 = local_740;
    local_770 = local_738;
    local_720 = local_740;
    local_718 = local_738;
    local_730 = local_740;
    local_728 = local_738;
    local_6f8 = local_740;
    local_6f0 = local_738;
    local_700 = &local_710;
    bVar2 = false;
    local_710 = local_768;
    local_708 = local_760;
    if (local_1ad8 == local_738) {
      local_6d8 = local_1ae0;
      local_6e0 = local_740;
      local_6e8 = local_738;
      if (local_738 == (char *)0x0) {
        local_6cc = 0;
      }
      else {
        local_6cc = memcmp(local_1ae0,local_740,(size_t)local_738);
      }
      bVar2 = local_6cc == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_750);
    }
  }
  llvm::StringLiteral::StringLiteral<4UL>(&local_1bc0,(char (*) [4])"v6z");
  llvm::StringLiteral::StringLiteral<5UL>(&local_1bd0,(char (*) [5])"v6zk");
  local_1be0 = "v6kz";
  local_e28 = strlen("v6kz");
  local_e30 = local_1be0;
  local_dc8 = local_1bc0.super_StringRef.Data;
  local_dc0 = (char *)local_1bc0.super_StringRef.Length;
  local_dd8 = local_1bd0.super_StringRef.Data;
  local_dd0 = (char *)local_1bd0.super_StringRef.Length;
  local_df0 = local_1bc0.super_StringRef.Data;
  local_de8 = (char *)local_1bc0.super_StringRef.Length;
  local_e00 = local_1be0;
  local_cd0 = local_1bc0.super_StringRef.Data;
  local_cc8 = (char *)local_1bc0.super_StringRef.Length;
  local_ce0.Data = local_1be0;
  local_df8 = local_e28;
  local_de0 = &local_1ae0;
  local_ce8 = &local_1ae0;
  local_ce0.Length = local_e28;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_cf8 = local_1ae0;
    local_cf0 = local_1ad8;
    local_d08 = local_cd0;
    local_d00 = local_cc8;
    local_cb0 = local_cd0;
    local_ca8 = local_cc8;
    local_cc0 = local_cd0;
    local_cb8 = local_cc8;
    local_c88 = local_cd0;
    local_c80 = local_cc8;
    local_c90 = &local_ca0;
    bVar2 = false;
    local_ca0 = local_cf8;
    local_c98 = local_cf0;
    if (local_1ad8 == local_cc8) {
      local_c68 = local_1ae0;
      local_c70 = local_cd0;
      local_c78 = local_cc8;
      if (local_cc8 == (char *)0x0) {
        local_c5c = 0;
      }
      else {
        local_c5c = memcmp(local_1ae0,local_cd0,(size_t)local_cc8);
      }
      bVar2 = local_c5c == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_ce0);
    }
  }
  local_e10 = local_dd8;
  local_e08 = local_dd0;
  local_e20 = local_e30;
  local_e18 = local_e28;
  local_d80 = local_dd8;
  local_d78 = local_dd0;
  local_d90.Data = local_e30;
  local_d90.Length = local_e28;
  local_d98 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_da8 = local_1ae0;
    local_da0 = local_1ad8;
    local_db8 = local_d80;
    local_db0 = local_d78;
    local_d60 = local_d80;
    local_d58 = local_d78;
    local_d70 = local_d80;
    local_d68 = local_d78;
    local_d38 = local_d80;
    local_d30 = local_d78;
    local_d40 = &local_d50;
    bVar2 = false;
    local_d50 = local_da8;
    local_d48 = local_da0;
    if (local_1ad8 == local_d78) {
      local_d18 = local_1ae0;
      local_d20 = local_d80;
      local_d28 = local_d78;
      if (local_d78 == (char *)0x0) {
        local_d0c = 0;
      }
      else {
        local_d0c = memcmp(local_1ae0,local_d80,(size_t)local_d78);
      }
      bVar2 = local_d0c == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_d90);
    }
  }
  llvm::StringLiteral::StringLiteral<3UL>(&local_1bf0,(char (*) [3])"v7");
  llvm::StringLiteral::StringLiteral<4UL>(&local_1c00,(char (*) [4])"v7a");
  llvm::StringLiteral::StringLiteral<5UL>(&local_1c10,(char (*) [5])"v7hl");
  llvm::StringLiteral::StringLiteral<4UL>(&local_1c20,(char (*) [4])"v7l");
  local_1c30 = "v7-a";
  local_f70 = strlen("v7-a");
  local_f78 = local_1c30;
  local_f88 = local_1c20.super_StringRef.Data;
  local_f80 = (char *)local_1c20.super_StringRef.Length;
  local_f98 = local_1c10.super_StringRef.Data;
  local_f90 = (char *)local_1c10.super_StringRef.Length;
  local_ef0 = local_1bf0.super_StringRef.Data;
  local_ee8 = (char *)local_1bf0.super_StringRef.Length;
  local_f00 = local_1c00.super_StringRef.Data;
  local_ef8 = (char *)local_1c00.super_StringRef.Length;
  local_f18 = local_1bf0.super_StringRef.Data;
  local_f10 = (char *)local_1bf0.super_StringRef.Length;
  local_f28 = local_1c30;
  local_ea8 = local_1bf0.super_StringRef.Data;
  local_ea0 = (char *)local_1bf0.super_StringRef.Length;
  local_eb8.Data = local_1c30;
  local_f20 = local_f70;
  local_f08 = &local_1ae0;
  local_ec0 = &local_1ae0;
  local_eb8.Length = local_f70;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_ed0 = local_1ae0;
    local_ec8 = local_1ad8;
    local_ee0 = local_ea8;
    local_ed8 = local_ea0;
    local_e88 = local_ea8;
    local_e80 = local_ea0;
    local_e98 = local_ea8;
    local_e90 = local_ea0;
    local_e60 = local_ea8;
    local_e58 = local_ea0;
    local_e68 = &local_e78;
    bVar2 = false;
    local_e78 = local_ed0;
    local_e70 = local_ec8;
    if (local_1ad8 == local_ea0) {
      local_e40 = local_1ae0;
      local_e48 = local_ea8;
      local_e50 = local_ea0;
      if (local_ea0 == (char *)0x0) {
        local_e34 = 0;
      }
      else {
        local_e34 = memcmp(local_1ae0,local_ea8,(size_t)local_ea0);
      }
      bVar2 = local_e34 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_eb8);
    }
  }
  local_f38 = local_f00;
  local_f30 = local_ef8;
  local_f48 = local_f98;
  local_f40 = local_f90;
  local_f58 = local_f88;
  local_f50 = local_f80;
  local_f68 = local_f78;
  local_f60 = local_f70;
  local_c48 = local_f78;
  local_c40 = local_f70;
  local_c58 = local_f88;
  local_c50 = local_f80;
  local_bd0 = local_f00;
  local_bc8 = local_ef8;
  local_be0 = local_f98;
  local_bd8 = local_f90;
  local_bf8 = local_f00;
  local_bf0 = local_ef8;
  local_c08 = local_f78;
  local_c00 = local_f70;
  local_b88 = local_f00;
  local_b80 = local_ef8;
  local_b98.Data = local_f78;
  local_b98.Length = local_f70;
  local_be8 = &local_1ae0;
  local_ba0 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_bb0 = local_1ae0;
    local_ba8 = local_1ad8;
    local_bc0 = local_b88;
    local_bb8 = local_b80;
    local_b68 = local_b88;
    local_b60 = local_b80;
    local_b78 = local_b88;
    local_b70 = local_b80;
    local_b40 = local_b88;
    local_b38 = local_b80;
    local_b48 = &local_b58;
    bVar2 = false;
    local_b58 = local_bb0;
    local_b50 = local_ba8;
    if (local_1ad8 == local_b80) {
      local_b20 = local_1ae0;
      local_b28 = local_b88;
      local_b30 = local_b80;
      if (local_b80 == (char *)0x0) {
        local_b14 = 0;
      }
      else {
        local_b14 = memcmp(local_1ae0,local_b88,(size_t)local_b80);
      }
      bVar2 = local_b14 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_b98);
    }
  }
  local_c18 = local_be0;
  local_c10 = local_bd8;
  local_c28 = local_c58;
  local_c20 = local_c50;
  local_c38 = local_c48;
  local_c30 = local_c40;
  local_b10 = local_c48;
  local_b08 = local_c40;
  local_aa8 = local_be0;
  local_aa0 = local_bd8;
  local_ab8 = local_c58;
  local_ab0 = local_c50;
  local_ad0 = local_be0;
  local_ac8 = local_bd8;
  local_ae0 = local_c48;
  local_ad8 = local_c40;
  local_9b0 = local_be0;
  local_9a8 = local_bd8;
  local_9c0.Data = local_c48;
  local_9c0.Length = local_c40;
  local_ac0 = &local_1ae0;
  local_9c8 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_9d8 = local_1ae0;
    local_9d0 = local_1ad8;
    local_9e8 = local_9b0;
    local_9e0 = local_9a8;
    local_990 = local_9b0;
    local_988 = local_9a8;
    local_9a0 = local_9b0;
    local_998 = local_9a8;
    local_968 = local_9b0;
    local_960 = local_9a8;
    local_970 = &local_980;
    bVar2 = false;
    local_980 = local_9d8;
    local_978 = local_9d0;
    if (local_1ad8 == local_9a8) {
      local_948 = local_1ae0;
      local_950 = local_9b0;
      local_958 = local_9a8;
      if (local_9a8 == (char *)0x0) {
        local_93c = 0;
      }
      else {
        local_93c = memcmp(local_1ae0,local_9b0,(size_t)local_9a8);
      }
      bVar2 = local_93c == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_9c0);
    }
  }
  local_af0 = local_ab8;
  local_ae8 = local_ab0;
  local_b00 = local_b10;
  local_af8 = local_b08;
  local_a60 = local_ab8;
  local_a58 = local_ab0;
  local_a70.Data = local_b10;
  local_a70.Length = local_b08;
  local_a78 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_a88 = local_1ae0;
    local_a80 = local_1ad8;
    local_a98 = local_a60;
    local_a90 = local_a58;
    local_a40 = local_a60;
    local_a38 = local_a58;
    local_a50 = local_a60;
    local_a48 = local_a58;
    local_a18 = local_a60;
    local_a10 = local_a58;
    local_a20 = &local_a30;
    bVar2 = false;
    local_a30 = local_a88;
    local_a28 = local_a80;
    if (local_1ad8 == local_a58) {
      local_9f8 = local_1ae0;
      local_a00 = local_a60;
      local_a08 = local_a58;
      if (local_a58 == (char *)0x0) {
        local_9ec = 0;
      }
      else {
        local_9ec = memcmp(local_1ae0,local_a60,(size_t)local_a58);
      }
      bVar2 = local_9ec == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_a70);
    }
  }
  llvm::StringLiteral::StringLiteral<4UL>(&local_1c40,(char (*) [4])"v7r");
  local_1c50 = "v7-r";
  local_1308.Length = strlen("v7-r");
  local_12f8 = local_1c40.super_StringRef.Data;
  local_12f0 = (char *)local_1c40.super_StringRef.Length;
  local_1308.Data = local_1c50;
  local_1310 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_1320 = local_1ae0;
    local_1318 = local_1ad8;
    local_1330 = local_12f8;
    local_1328 = local_12f0;
    local_12d8 = local_12f8;
    local_12d0 = local_12f0;
    local_12e8 = local_12f8;
    local_12e0 = local_12f0;
    local_12b0 = local_12f8;
    local_12a8 = local_12f0;
    local_12b8 = &local_12c8;
    bVar2 = false;
    local_12c8 = local_1320;
    local_12c0 = local_1318;
    if (local_1ad8 == local_12f0) {
      local_1290 = local_1ae0;
      local_1298 = local_12f8;
      local_12a0 = local_12f0;
      if (local_12f0 == (char *)0x0) {
        local_1284 = 0;
      }
      else {
        local_1284 = memcmp(local_1ae0,local_12f8,(size_t)local_12f0);
      }
      bVar2 = local_1284 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_1308);
    }
  }
  llvm::StringLiteral::StringLiteral<4UL>(&local_1c60,(char (*) [4])"v7m");
  local_1c70 = "v7-m";
  local_13b8.Length = strlen("v7-m");
  local_13a8 = local_1c60.super_StringRef.Data;
  local_13a0 = (char *)local_1c60.super_StringRef.Length;
  local_13b8.Data = local_1c70;
  local_13c0 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_13d0 = local_1ae0;
    local_13c8 = local_1ad8;
    local_13e0 = local_13a8;
    local_13d8 = local_13a0;
    local_1388 = local_13a8;
    local_1380 = local_13a0;
    local_1398 = local_13a8;
    local_1390 = local_13a0;
    local_1360 = local_13a8;
    local_1358 = local_13a0;
    local_1368 = &local_1378;
    bVar2 = false;
    local_1378 = local_13d0;
    local_1370 = local_13c8;
    if (local_1ad8 == local_13a0) {
      local_1340 = local_1ae0;
      local_1348 = local_13a8;
      local_1350 = local_13a0;
      if (local_13a0 == (char *)0x0) {
        local_1334 = 0;
      }
      else {
        local_1334 = memcmp(local_1ae0,local_13a8,(size_t)local_13a0);
      }
      bVar2 = local_1334 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_13b8);
    }
  }
  llvm::StringLiteral::StringLiteral<5UL>(&local_1c80,(char (*) [5])"v7em");
  local_1c90 = "v7e-m";
  local_1468.Length = strlen("v7e-m");
  local_1458 = local_1c80.super_StringRef.Data;
  local_1450 = (char *)local_1c80.super_StringRef.Length;
  local_1468.Data = local_1c90;
  local_1470 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_1480 = local_1ae0;
    local_1478 = local_1ad8;
    local_1490 = local_1458;
    local_1488 = local_1450;
    local_1438 = local_1458;
    local_1430 = local_1450;
    local_1448 = local_1458;
    local_1440 = local_1450;
    local_1410 = local_1458;
    local_1408 = local_1450;
    local_1418 = &local_1428;
    bVar2 = false;
    local_1428 = local_1480;
    local_1420 = local_1478;
    if (local_1ad8 == local_1450) {
      local_13f0 = local_1ae0;
      local_13f8 = local_1458;
      local_1400 = local_1450;
      if (local_1450 == (char *)0x0) {
        local_13e4 = 0;
      }
      else {
        local_13e4 = memcmp(local_1ae0,local_1458,(size_t)local_1450);
      }
      bVar2 = local_13e4 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_1468);
    }
  }
  llvm::StringLiteral::StringLiteral<3UL>(&local_1ca0,(char (*) [3])0x33d10d);
  llvm::StringLiteral::StringLiteral<4UL>(&local_1cb0,(char (*) [4])"v8a");
  llvm::StringLiteral::StringLiteral<4UL>(&local_1cc0,(char (*) [4])"v8l");
  llvm::StringLiteral::StringLiteral<8UL>(&local_1cd0,(char (*) [8])"aarch64");
  llvm::StringLiteral::StringLiteral<6UL>(&local_1ce0,(char (*) [6])"arm64");
  local_1cf0 = "v8-a";
  local_5e0 = strlen("v8-a");
  local_5e8 = local_1cf0;
  local_5f8 = local_1ce0.super_StringRef.Data;
  local_5f0 = (char *)local_1ce0.super_StringRef.Length;
  local_608 = local_1cd0.super_StringRef.Data;
  local_600 = (char *)local_1cd0.super_StringRef.Length;
  local_618 = local_1cc0.super_StringRef.Data;
  local_610 = (char *)local_1cc0.super_StringRef.Length;
  local_550 = local_1ca0.super_StringRef.Data;
  local_548 = (char *)local_1ca0.super_StringRef.Length;
  local_560 = local_1cb0.super_StringRef.Data;
  local_558 = (char *)local_1cb0.super_StringRef.Length;
  local_578 = local_1ca0.super_StringRef.Data;
  local_570 = (char *)local_1ca0.super_StringRef.Length;
  local_588 = local_1cf0;
  local_508 = local_1ca0.super_StringRef.Data;
  local_500 = (char *)local_1ca0.super_StringRef.Length;
  local_518.Data = local_1cf0;
  local_580 = local_5e0;
  local_568 = &local_1ae0;
  local_520 = &local_1ae0;
  local_518.Length = local_5e0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_530 = local_1ae0;
    local_528 = local_1ad8;
    local_540 = local_508;
    local_538 = local_500;
    local_4e8 = local_508;
    local_4e0 = local_500;
    local_4f8 = local_508;
    local_4f0 = local_500;
    local_4c0 = local_508;
    local_4b8 = local_500;
    local_4c8 = &local_4d8;
    bVar2 = false;
    local_4d8 = local_530;
    local_4d0 = local_528;
    if (local_1ad8 == local_500) {
      local_4a0 = local_1ae0;
      local_4a8 = local_508;
      local_4b0 = local_500;
      if (local_500 == (char *)0x0) {
        local_494 = 0;
      }
      else {
        local_494 = memcmp(local_1ae0,local_508,(size_t)local_500);
      }
      bVar2 = local_494 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_518);
    }
  }
  local_598 = local_560;
  local_590 = local_558;
  local_5a8 = local_618;
  local_5a0 = local_610;
  local_5b8 = local_608;
  local_5b0 = local_600;
  local_5c8 = local_5f8;
  local_5c0 = local_5f0;
  local_5d8 = local_5e8;
  local_5d0 = local_5e0;
  local_470 = local_5e8;
  local_468 = local_5e0;
  local_480 = local_5f8;
  local_478 = local_5f0;
  local_490 = local_608;
  local_488 = local_600;
  local_3e8 = local_560;
  local_3e0 = local_558;
  local_3f8 = local_618;
  local_3f0 = local_610;
  local_410 = local_560;
  local_408 = local_558;
  local_420 = local_5e8;
  local_418 = local_5e0;
  local_3a0 = local_560;
  local_398 = local_558;
  local_3b0.Data = local_5e8;
  local_3b0.Length = local_5e0;
  local_400 = &local_1ae0;
  local_3b8 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_3c8 = local_1ae0;
    local_3c0 = local_1ad8;
    local_3d8 = local_3a0;
    local_3d0 = local_398;
    local_380 = local_3a0;
    local_378 = local_398;
    local_390 = local_3a0;
    local_388 = local_398;
    local_358 = local_3a0;
    local_350 = local_398;
    local_360 = &local_370;
    bVar2 = false;
    local_370 = local_3c8;
    local_368 = local_3c0;
    if (local_1ad8 == local_398) {
      local_338 = local_1ae0;
      local_340 = local_3a0;
      local_348 = local_398;
      if (local_398 == (char *)0x0) {
        local_32c = 0;
      }
      else {
        local_32c = memcmp(local_1ae0,local_3a0,(size_t)local_398);
      }
      bVar2 = local_32c == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_3b0);
    }
  }
  local_430 = local_3f8;
  local_428 = local_3f0;
  local_440 = local_490;
  local_438 = local_488;
  local_450 = local_480;
  local_448 = local_478;
  local_460 = local_470;
  local_458 = local_468;
  local_318 = local_470;
  local_310 = local_468;
  local_328 = local_480;
  local_320 = local_478;
  local_2a0 = local_3f8;
  local_298 = local_3f0;
  local_2b0 = local_490;
  local_2a8 = local_488;
  local_2c8 = local_3f8;
  local_2c0 = local_3f0;
  local_2d8 = local_470;
  local_2d0 = local_468;
  local_258 = local_3f8;
  local_250 = local_3f0;
  local_268.Data = local_470;
  local_268.Length = local_468;
  local_2b8 = &local_1ae0;
  local_270 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_280 = local_1ae0;
    local_278 = local_1ad8;
    local_290 = local_258;
    local_288 = local_250;
    local_238 = local_258;
    local_230 = local_250;
    local_248 = local_258;
    local_240 = local_250;
    local_210 = local_258;
    local_208 = local_250;
    local_218 = &local_228;
    bVar2 = false;
    local_228 = local_280;
    local_220 = local_278;
    if (local_1ad8 == local_250) {
      local_1f0 = local_1ae0;
      local_1f8 = local_258;
      local_200 = local_250;
      if (local_250 == (char *)0x0) {
        local_1e4 = 0;
      }
      else {
        local_1e4 = memcmp(local_1ae0,local_258,(size_t)local_250);
      }
      bVar2 = local_1e4 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_268);
    }
  }
  local_2e8 = local_2b0;
  local_2e0 = local_2a8;
  local_2f8 = local_328;
  local_2f0 = local_320;
  local_308 = local_318;
  local_300 = local_310;
  local_1e0 = local_318;
  local_1d8 = local_310;
  local_178 = local_2b0;
  local_170 = local_2a8;
  local_188 = local_328;
  local_180 = local_320;
  local_1a0 = local_2b0;
  local_198 = local_2a8;
  local_1b0 = local_318;
  local_1a8 = local_310;
  local_80 = local_2b0;
  local_78 = local_2a8;
  local_90.Data = local_318;
  local_90.Length = local_310;
  local_190 = &local_1ae0;
  local_98 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_a8 = local_1ae0;
    local_a0 = local_1ad8;
    local_b8 = local_80;
    local_b0 = local_78;
    local_60 = local_80;
    local_58 = local_78;
    local_70 = local_80;
    local_68 = local_78;
    local_38 = local_80;
    local_30 = local_78;
    local_40 = &local_50;
    bVar2 = false;
    local_50 = local_a8;
    local_48 = local_a0;
    if (local_1ad8 == local_78) {
      local_18 = local_1ae0;
      local_20 = local_80;
      local_28 = local_78;
      if (local_78 == (char *)0x0) {
        local_c = 0;
      }
      else {
        local_c = memcmp(local_1ae0,local_80,(size_t)local_78);
      }
      bVar2 = local_c == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_90);
    }
  }
  local_1c0 = local_188;
  local_1b8 = local_180;
  local_1d0 = local_1e0;
  local_1c8 = local_1d8;
  local_130 = local_188;
  local_128 = local_180;
  local_140.Data = local_1e0;
  local_140.Length = local_1d8;
  local_148 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_158 = local_1ae0;
    local_150 = local_1ad8;
    local_168 = local_130;
    local_160 = local_128;
    local_110 = local_130;
    local_108 = local_128;
    local_120 = local_130;
    local_118 = local_128;
    local_e8 = local_130;
    local_e0 = local_128;
    local_f0 = &local_100;
    bVar2 = false;
    local_100 = local_158;
    local_f8 = local_150;
    if (local_1ad8 == local_128) {
      local_c8 = local_1ae0;
      local_d0 = local_130;
      local_d8 = local_128;
      if (local_128 == (char *)0x0) {
        local_bc = 0;
      }
      else {
        local_bc = memcmp(local_1ae0,local_130,(size_t)local_128);
      }
      bVar2 = local_bc == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_140);
    }
  }
  llvm::StringLiteral::StringLiteral<6UL>(&local_1d00,(char (*) [6])0x33d1b8);
  local_1d10 = "v8.1-a";
  local_1518.Length = strlen("v8.1-a");
  local_1508 = local_1d00.super_StringRef.Data;
  local_1500 = (char *)local_1d00.super_StringRef.Length;
  local_1518.Data = local_1d10;
  local_1520 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_1530 = local_1ae0;
    local_1528 = local_1ad8;
    local_1540 = local_1508;
    local_1538 = local_1500;
    local_14e8 = local_1508;
    local_14e0 = local_1500;
    local_14f8 = local_1508;
    local_14f0 = local_1500;
    local_14c0 = local_1508;
    local_14b8 = local_1500;
    local_14c8 = &local_14d8;
    bVar2 = false;
    local_14d8 = local_1530;
    local_14d0 = local_1528;
    if (local_1ad8 == local_1500) {
      local_14a0 = local_1ae0;
      local_14a8 = local_1508;
      local_14b0 = local_1500;
      if (local_1500 == (char *)0x0) {
        local_1494 = 0;
      }
      else {
        local_1494 = memcmp(local_1ae0,local_1508,(size_t)local_1500);
      }
      bVar2 = local_1494 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_1518);
    }
  }
  llvm::StringLiteral::StringLiteral<6UL>(&local_1d20,(char (*) [6])0x33d1bf);
  local_1d30 = "v8.2-a";
  local_15c8.Length = strlen("v8.2-a");
  local_15b8 = local_1d20.super_StringRef.Data;
  local_15b0 = (char *)local_1d20.super_StringRef.Length;
  local_15c8.Data = local_1d30;
  local_15d0 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_15e0 = local_1ae0;
    local_15d8 = local_1ad8;
    local_15f0 = local_15b8;
    local_15e8 = local_15b0;
    local_1598 = local_15b8;
    local_1590 = local_15b0;
    local_15a8 = local_15b8;
    local_15a0 = local_15b0;
    local_1570 = local_15b8;
    local_1568 = local_15b0;
    local_1578 = &local_1588;
    bVar2 = false;
    local_1588 = local_15e0;
    local_1580 = local_15d8;
    if (local_1ad8 == local_15b0) {
      local_1550 = local_1ae0;
      local_1558 = local_15b8;
      local_1560 = local_15b0;
      if (local_15b0 == (char *)0x0) {
        local_1544 = 0;
      }
      else {
        local_1544 = memcmp(local_1ae0,local_15b8,(size_t)local_15b0);
      }
      bVar2 = local_1544 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_15c8);
    }
  }
  llvm::StringLiteral::StringLiteral<6UL>(&local_1d40,(char (*) [6])0x33d1c6);
  local_1d50 = "v8.3-a";
  local_1678.Length = strlen("v8.3-a");
  local_1668 = local_1d40.super_StringRef.Data;
  local_1660 = (char *)local_1d40.super_StringRef.Length;
  local_1678.Data = local_1d50;
  local_1680 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_1690 = local_1ae0;
    local_1688 = local_1ad8;
    local_16a0 = local_1668;
    local_1698 = local_1660;
    local_1648 = local_1668;
    local_1640 = local_1660;
    local_1658 = local_1668;
    local_1650 = local_1660;
    local_1620 = local_1668;
    local_1618 = local_1660;
    local_1628 = &local_1638;
    bVar2 = false;
    local_1638 = local_1690;
    local_1630 = local_1688;
    if (local_1ad8 == local_1660) {
      local_1600 = local_1ae0;
      local_1608 = local_1668;
      local_1610 = local_1660;
      if (local_1660 == (char *)0x0) {
        local_15f4 = 0;
      }
      else {
        local_15f4 = memcmp(local_1ae0,local_1668,(size_t)local_1660);
      }
      bVar2 = local_15f4 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_1678);
    }
  }
  llvm::StringLiteral::StringLiteral<6UL>(&local_1d60,(char (*) [6])0x33d1cd);
  local_1d70 = "v8.4-a";
  local_1728.Length = strlen("v8.4-a");
  local_1718 = local_1d60.super_StringRef.Data;
  local_1710 = (char *)local_1d60.super_StringRef.Length;
  local_1728.Data = local_1d70;
  local_1730 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_1740 = local_1ae0;
    local_1738 = local_1ad8;
    local_1750 = local_1718;
    local_1748 = local_1710;
    local_16f8 = local_1718;
    local_16f0 = local_1710;
    local_1708 = local_1718;
    local_1700 = local_1710;
    local_16d0 = local_1718;
    local_16c8 = local_1710;
    local_16d8 = &local_16e8;
    bVar2 = false;
    local_16e8 = local_1740;
    local_16e0 = local_1738;
    if (local_1ad8 == local_1710) {
      local_16b0 = local_1ae0;
      local_16b8 = local_1718;
      local_16c0 = local_1710;
      if (local_1710 == (char *)0x0) {
        local_16a4 = 0;
      }
      else {
        local_16a4 = memcmp(local_1ae0,local_1718,(size_t)local_1710);
      }
      bVar2 = local_16a4 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_1728);
    }
  }
  llvm::StringLiteral::StringLiteral<4UL>(&local_1d80,(char (*) [4])"v8r");
  local_1d90 = "v8-r";
  local_17d8.Length = strlen("v8-r");
  local_17c8 = local_1d80.super_StringRef.Data;
  local_17c0 = (char *)local_1d80.super_StringRef.Length;
  local_17d8.Data = local_1d90;
  local_17e0 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_17f0 = local_1ae0;
    local_17e8 = local_1ad8;
    local_1800 = local_17c8;
    local_17f8 = local_17c0;
    local_17a8 = local_17c8;
    local_17a0 = local_17c0;
    local_17b8 = local_17c8;
    local_17b0 = local_17c0;
    local_1780 = local_17c8;
    local_1778 = local_17c0;
    local_1788 = &local_1798;
    bVar2 = false;
    local_1798 = local_17f0;
    local_1790 = local_17e8;
    if (local_1ad8 == local_17c0) {
      local_1760 = local_1ae0;
      local_1768 = local_17c8;
      local_1770 = local_17c0;
      if (local_17c0 == (char *)0x0) {
        local_1754 = 0;
      }
      else {
        local_1754 = memcmp(local_1ae0,local_17c8,(size_t)local_17c0);
      }
      bVar2 = local_1754 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_17d8);
    }
  }
  llvm::StringLiteral::StringLiteral<9UL>(&local_1da0,(char (*) [9])"v8m.base");
  local_1db0 = "v8-m.base";
  local_1888.Length = strlen("v8-m.base");
  local_1878 = local_1da0.super_StringRef.Data;
  local_1870 = (char *)local_1da0.super_StringRef.Length;
  local_1888.Data = local_1db0;
  local_1890 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_18a0 = local_1ae0;
    local_1898 = local_1ad8;
    local_18b0 = local_1878;
    local_18a8 = local_1870;
    local_1858 = local_1878;
    local_1850 = local_1870;
    local_1868 = local_1878;
    local_1860 = local_1870;
    local_1830 = local_1878;
    local_1828 = local_1870;
    local_1838 = &local_1848;
    bVar2 = false;
    local_1848 = local_18a0;
    local_1840 = local_1898;
    if (local_1ad8 == local_1870) {
      local_1810 = local_1ae0;
      local_1818 = local_1878;
      local_1820 = local_1870;
      if (local_1870 == (char *)0x0) {
        local_1804 = 0;
      }
      else {
        local_1804 = memcmp(local_1ae0,local_1878,(size_t)local_1870);
      }
      bVar2 = local_1804 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_1888);
    }
  }
  llvm::StringLiteral::StringLiteral<9UL>(&local_1dc0,(char (*) [9])"v8m.main");
  local_1938.Length = strlen("v8-m.main");
  local_1928 = local_1dc0.super_StringRef.Data;
  local_1920 = (char *)local_1dc0.super_StringRef.Length;
  local_1938.Data = "v8-m.main";
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (!bVar2) {
    local_18f8 = local_1ae0;
    local_18f0 = local_1ad8;
    local_1908 = local_1928;
    local_1900 = local_1920;
    local_1918 = local_1928;
    local_1910 = local_1920;
    local_18e0 = local_1928;
    local_18d8 = local_1920;
    local_18e8 = &local_18f8;
    bVar2 = false;
    if (local_1ad8 == local_1920) {
      local_18c0 = local_1ae0;
      local_18c8 = local_1928;
      local_18d0 = local_1920;
      if (local_1920 == (char *)0x0) {
        local_18b4 = 0;
      }
      else {
        local_18b4 = memcmp(local_1ae0,local_1928,(size_t)local_1920);
      }
      bVar2 = local_18b4 == 0;
    }
    if (bVar2) {
      llvm::Optional<llvm::StringRef>::operator=(&OStack_1ad0,&local_1938);
    }
  }
  local_fb8 = local_1ab8;
  local_fb0 = Arch_local.Data;
  local_fc0 = &local_1ae0;
  bVar2 = llvm::Optional::operator_cast_to_bool((Optional *)&OStack_1ad0);
  if (bVar2) {
    pSVar3 = llvm::Optional<llvm::StringRef>::operator*(&OStack_1ad0);
    local_fa8 = pSVar3->Data;
    local_fa0 = (char *)pSVar3->Length;
  }
  else {
    local_fa8 = local_fb8;
    local_fa0 = local_fb0;
  }
  SVar1.Length = (size_t)local_fa0;
  SVar1.Data = local_fa8;
  return SVar1;
}

Assistant:

static StringRef getArchSynonym(StringRef Arch) {
  return StringSwitch<StringRef>(Arch)
      .Case("v5", "v5t")
      .Case("v5e", "v5te")
      .Case("v6j", "v6")
      .Case("v6hl", "v6k")
      .Cases("v6m", "v6sm", "v6s-m", "v6-m")
      .Cases("v6z", "v6zk", "v6kz")
      .Cases("v7", "v7a", "v7hl", "v7l", "v7-a")
      .Case("v7r", "v7-r")
      .Case("v7m", "v7-m")
      .Case("v7em", "v7e-m")
      .Cases("v8", "v8a", "v8l", "aarch64", "arm64", "v8-a")
      .Case("v8.1a", "v8.1-a")
      .Case("v8.2a", "v8.2-a")
      .Case("v8.3a", "v8.3-a")
      .Case("v8.4a", "v8.4-a")
      .Case("v8r", "v8-r")
      .Case("v8m.base", "v8-m.base")
      .Case("v8m.main", "v8-m.main")
      .Default(Arch);
}